

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O1

serialData * __thiscall
MinVR::VRDataQueue::serialize_abi_cxx11_(serialData *__return_storage_ptr__,VRDataQueue *this)

{
  ostream oVar1;
  long *plVar2;
  ostream *this_00;
  undefined8 *puVar3;
  _Base_ptr p_Var4;
  long *plVar5;
  ulong *puVar6;
  ostream *poVar7;
  ulong uVar8;
  undefined8 uVar9;
  ostringstream timeStamp;
  ostringstream lenStr;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  long lStack_3d0;
  long *local_3c8;
  undefined8 local_3c0;
  long local_3b8;
  undefined8 uStack_3b0;
  string local_3a8;
  ulong *local_388;
  long local_380;
  ulong local_378;
  long lStack_370;
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  _Rb_tree_node_base *local_348;
  long *local_340 [2];
  long local_330 [2];
  long *local_320;
  long local_318;
  long local_310;
  long lStack_308;
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_3c8,0,(char *)0x0,0x1612ab);
  local_3e8 = &local_3d8;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_3d8 = *plVar5;
    lStack_3d0 = plVar2[3];
  }
  else {
    local_3d8 = *plVar5;
    local_3e8 = (long *)*plVar2;
  }
  local_3e0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_3e8);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_310 = *plVar5;
    lStack_308 = plVar2[3];
    local_320 = &local_310;
  }
  else {
    local_310 = *plVar5;
    local_320 = (long *)*plVar2;
  }
  local_318 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_320);
  if (local_320 != &local_310) {
    operator_delete(local_320,local_310 + 1);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,local_3d8 + 1);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,local_3b8 + 1);
  }
  p_Var4 = (this->_dataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_348 = &(this->_dataMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var4 != local_348) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
      this_00 = std::ostream::_M_insert<long_long>((longlong)&local_320);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"-",1);
      poVar7 = this_00 + *(long *)(*(long *)this_00 + -0x18);
      if (this_00[*(long *)(*(long *)this_00 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar1 = (ostream)std::ios::widen((char)poVar7);
        poVar7[0xe0] = oVar1;
        poVar7[0xe1] = (ostream)0x1;
      }
      poVar7[0xe0] = (ostream)0x30;
      *(undefined8 *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = 3;
      std::ostream::operator<<(this_00,*(int *)&p_Var4[1]._M_parent);
      std::__cxx11::stringbuf::str();
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_340,0,(char *)0x0,0x1611ae);
      local_368 = &local_358;
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_358 = *plVar5;
        lStack_350 = plVar2[3];
      }
      else {
        local_358 = *plVar5;
        local_368 = (long *)*plVar2;
      }
      local_360 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_368);
      puVar6 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar6) {
        local_378 = *puVar6;
        lStack_370 = plVar2[3];
        local_388 = &local_378;
      }
      else {
        local_378 = *puVar6;
        local_388 = (ulong *)*plVar2;
      }
      local_380 = plVar2[1];
      *plVar2 = (long)puVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      VRDataQueueItem::serialize_abi_cxx11_(&local_3a8,(VRDataQueueItem *)&p_Var4[1]._M_left);
      uVar8 = 0xf;
      if (local_388 != &local_378) {
        uVar8 = local_378;
      }
      if (uVar8 < local_3a8._M_string_length + local_380) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          uVar9 = local_3a8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_3a8._M_string_length + local_380) goto LAB_0013d6cc;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_3a8,0,(char *)0x0,(ulong)local_388);
      }
      else {
LAB_0013d6cc:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_388,(ulong)local_3a8._M_dataplus._M_p);
      }
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        local_3b8 = *plVar2;
        uStack_3b0 = puVar3[3];
        local_3c8 = &local_3b8;
      }
      else {
        local_3b8 = *plVar2;
        local_3c8 = (long *)*puVar3;
      }
      local_3c0 = puVar3[1];
      *puVar3 = plVar2;
      puVar3[1] = 0;
      *(undefined1 *)plVar2 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_3c8);
      local_3e8 = &local_3d8;
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_3d8 = *plVar5;
        lStack_3d0 = plVar2[3];
      }
      else {
        local_3d8 = *plVar5;
        local_3e8 = (long *)*plVar2;
      }
      local_3e0 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_3e8);
      if (local_3e8 != &local_3d8) {
        operator_delete(local_3e8,local_3d8 + 1);
      }
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8,local_3b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if (local_388 != &local_378) {
        operator_delete(local_388,local_378 + 1);
      }
      if (local_368 != &local_358) {
        operator_delete(local_368,local_358 + 1);
      }
      if (local_340[0] != local_330) {
        operator_delete(local_340[0],local_330[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
      std::ios_base::~ios_base(local_2b0);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_348);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

VRDataQueue::serialData VRDataQueue::serialize() {

  std::ostringstream lenStr;
  lenStr << _dataMap.size();

  VRDataQueue::serialData out;

  out = "<VRDataQueue num=\"" + lenStr.str() + "\">";
  for (VRDataList::iterator it = _dataMap.begin(); it != _dataMap.end(); ++it) {
    std::ostringstream timeStamp;
    timeStamp << it->first.first << "-" << std::setfill('0') << std::setw(3) << it->first.second;
    out += "<VRDataQueueItem timeStamp=\"" + timeStamp.str() + "\">" +
      it->second.serialize() + "</VRDataQueueItem>";
  }
  out += "</VRDataQueue>";

  return out;
}